

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O3

void bson_iter_document(bson_iter_t *iter,uint32_t *document_len,uint8_t **document)

{
  uint8_t *puVar1;
  long *extraout_RDX;
  char *key;
  bson_iter_t *unaff_RBX;
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_document_cold_3();
LAB_001105f3:
    bson_iter_document_cold_2();
  }
  else {
    if (document_len == (uint32_t *)0x0) goto LAB_001105f3;
    if (document != (uint8_t **)0x0) {
      *document = (uint8_t *)0x0;
      *document_len = 0;
      if (iter->raw[iter->type] == '\x03') {
        *document_len = *(uint32_t *)(iter->raw + iter->d1);
        *document = iter->raw + iter->d1;
      }
      return;
    }
  }
  bson_iter_document_cold_1();
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_array_cold_3();
LAB_0011063e:
    bson_iter_array_cold_2();
  }
  else {
    if ((bson_t *)document_len == (bson_t *)0x0) goto LAB_0011063e;
    if (extraout_RDX != (long *)0x0) {
      *extraout_RDX = 0;
      ((bson_t *)document_len)->flags = 0;
      if (iter->raw[iter->type] == '\x04') {
        ((bson_t *)document_len)->flags = *(uint32_t *)(iter->raw + iter->d1);
        *extraout_RDX = (long)(iter->raw + iter->d1);
      }
      return;
    }
  }
  bson_iter_array_cold_1();
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_init_find_cold_3();
LAB_001106ab:
    bson_iter_init_find_cold_2();
  }
  else {
    if ((bson_t *)document_len == (bson_t *)0x0) goto LAB_001106ab;
    if (key != (char *)0x0) {
      unaff_RBX = iter;
      if (4 < ((bson_t *)document_len)->len) {
        puVar1 = bson_get_data((bson_t *)document_len);
        iter->raw = puVar1;
        iter->len = ((bson_t *)document_len)->len;
        iter->d1 = 0;
        iter->d2 = 0;
        iter->d3 = 0;
        iter->d4 = 0;
        iter->off = 0;
        iter->type = 0;
        iter->key = 0;
        iter->d1 = 0;
        iter->next_off = 4;
        iter->err_off = 0;
        _bson_iter_find_with_len(iter,key,-1);
        return;
      }
      goto LAB_001106b5;
    }
  }
  bson_iter_init_find_cold_1();
LAB_001106b5:
  (unaff_RBX->value).value.v_regex.options = (char *)0x0;
  *(undefined8 *)((long)&(unaff_RBX->value).value + 0x10) = 0;
  (unaff_RBX->value).value_type = BSON_TYPE_EOD;
  (unaff_RBX->value).padding = 0;
  (unaff_RBX->value).value.v_int64 = 0;
  unaff_RBX->d3 = 0;
  unaff_RBX->d4 = 0;
  unaff_RBX->next_off = 0;
  unaff_RBX->err_off = 0;
  unaff_RBX->type = 0;
  unaff_RBX->key = 0;
  unaff_RBX->d1 = 0;
  unaff_RBX->d2 = 0;
  unaff_RBX->raw = (uint8_t *)0x0;
  unaff_RBX->len = 0;
  unaff_RBX->off = 0;
  return;
}

Assistant:

void
bson_iter_document (const bson_iter_t *iter,  /* IN */
                    uint32_t *document_len,   /* OUT */
                    const uint8_t **document) /* OUT */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (document_len);
   BSON_ASSERT (document);

   *document = NULL;
   *document_len = 0;

   if (ITER_TYPE (iter) == BSON_TYPE_DOCUMENT) {
      memcpy (document_len, (iter->raw + iter->d1), sizeof (*document_len));
      *document_len = BSON_UINT32_FROM_LE (*document_len);
      *document = (iter->raw + iter->d1);
   }
}